

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

string * __thiscall
cmCTestCoverageHandler::FindFile
          (string *__return_storage_ptr__,cmCTestCoverageHandler *this,
          cmCTestCoverageHandlerContainer *cont,string *fileName)

{
  bool bVar1;
  string fullName;
  string fileNameNoE;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_58,fileName);
  std::operator+(&local_98,&cont->SourceDir,"/");
  std::operator+(&local_78,&local_98,&local_58);
  std::operator+(&local_b8,&local_78,".py");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = cmsys::SystemTools::FileExists(local_b8._M_dataplus._M_p);
  if (!bVar1) {
    std::operator+(&local_38,&cont->BinaryDir,"/");
    std::operator+(&local_98,&local_38,&local_58);
    std::operator+(&local_78,&local_98,".py");
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_38);
    bVar1 = cmsys::SystemTools::FileExists(local_b8._M_dataplus._M_p);
    if (!bVar1) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_78);
      goto LAB_002fc912;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,local_b8.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b8.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_b8._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,local_b8.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_b8._M_string_length;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
LAB_002fc912:
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestCoverageHandler::FindFile(
  cmCTestCoverageHandlerContainer* cont, std::string const& fileName)
{
  std::string fileNameNoE =
    cmSystemTools::GetFilenameWithoutLastExtension(fileName);
  // First check in source and binary directory
  std::string fullName = cont->SourceDir + "/" + fileNameNoE + ".py";
  if (cmSystemTools::FileExists(fullName.c_str())) {
    return fullName;
  }
  fullName = cont->BinaryDir + "/" + fileNameNoE + ".py";
  if (cmSystemTools::FileExists(fullName.c_str())) {
    return fullName;
  }
  return "";
}